

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

void __thiscall google::protobuf::UnknownFieldSet::DeleteByNumber(UnknownFieldSet *this,int number)

{
  UnknownField *this_00;
  pointer pUVar1;
  _Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  *this_01;
  anon_union_8_5_912831f5_for_data_ aVar2;
  uint32 uVar3;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *this_02;
  int i;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  
  this_02 = this->fields_;
  if (this_02 !=
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    lVar6 = 0;
    uVar4 = 0;
    uVar5 = 0;
    while( true ) {
      pUVar1 = (this_02->
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this_02->
                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1 >> 4) <= uVar4)
      break;
      this_00 = (UnknownField *)((long)&pUVar1->number_ + lVar6);
      if (*(int *)((long)&pUVar1->number_ + lVar6) == number) {
        UnknownField::Delete(this_00);
      }
      else {
        if (uVar4 != uVar5) {
          uVar3 = this_00->type_;
          aVar2 = this_00->data_;
          pUVar1 = pUVar1 + (int)uVar5;
          pUVar1->number_ = this_00->number_;
          pUVar1->type_ = uVar3;
          pUVar1->data_ = aVar2;
        }
        uVar5 = uVar5 + 1;
      }
      uVar4 = uVar4 + 1;
      this_02 = this->fields_;
      lVar6 = lVar6 + 0x10;
    }
    std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
    resize(this_02,(long)(int)uVar5);
    if (uVar5 == 0) {
      this_01 = &this->fields_->
                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ;
      if (this_01 !=
          (_Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           *)0x0) {
        std::
        _Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ::~_Vector_base(this_01);
      }
      operator_delete(this_01,0x18);
      this->fields_ =
           (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            *)0x0;
    }
  }
  return;
}

Assistant:

void UnknownFieldSet::DeleteByNumber(int number) {
  if (fields_ == NULL) return;
  int left = 0;  // The number of fields left after deletion.
  for (int i = 0; i < fields_->size(); ++i) {
    UnknownField* field = &(*fields_)[i];
    if (field->number() == number) {
      field->Delete();
    } else {
      if (i != left) {
        (*fields_)[left] = (*fields_)[i];
      }
      ++left;
    }
  }
  fields_->resize(left);
  if (left == 0) {
    // maintain invariant: never hold fields_ if empty.
    delete fields_;
    fields_ = NULL;
  }
}